

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O1

void sp_solve(int neqns,int *xlnz,double *lnz,int *xnzsub,int *nzsub,double *diag,double *rhs)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  
  if (0 < neqns) {
    uVar6 = 1;
    do {
      dVar8 = rhs[uVar6 - 1];
      dVar1 = diag[uVar6 - 1];
      rhs[uVar6 - 1] = dVar8 / dVar1;
      iVar4 = xlnz[uVar6 - 1];
      iVar2 = xlnz[uVar6];
      if (iVar4 < iVar2) {
        iVar3 = xnzsub[uVar6 - 1];
        lVar5 = 0;
        do {
          rhs[(long)nzsub[(long)iVar3 + lVar5 + -1] + -1] =
               rhs[(long)nzsub[(long)iVar3 + lVar5 + -1] + -1] -
               lnz[(long)iVar4 + lVar5 + -1] * (dVar8 / dVar1);
          lVar5 = lVar5 + 1;
        } while ((long)iVar2 - (long)iVar4 != lVar5);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != neqns + 1);
  }
  if (0 < neqns) {
    uVar6 = (ulong)(uint)neqns;
    iVar4 = 1;
    do {
      dVar8 = rhs[uVar6 - 1];
      iVar2 = xlnz[uVar6 - 1];
      if (iVar2 < xlnz[uVar6]) {
        lVar5 = 0;
        do {
          dVar8 = dVar8 - lnz[(long)iVar2 + lVar5 + -1] *
                          rhs[(long)nzsub[(long)xnzsub[uVar6 - 1] + lVar5 + -1] + -1];
          lVar5 = lVar5 + 1;
        } while ((long)xlnz[uVar6] - (long)iVar2 != lVar5);
      }
      rhs[uVar6 - 1] = dVar8 / diag[uVar6 - 1];
      uVar6 = uVar6 - 1;
      bVar7 = iVar4 != neqns;
      iVar4 = iVar4 + 1;
    } while (bVar7);
  }
  return;
}

Assistant:

void sp_solve(int neqns, int* xlnz, double* lnz, int* xnzsub,
           int* nzsub, double* diag, double* rhs)
{
    int i, isub;
    double rhsj, s;

    /* Adjust from C to Fortran */

    --xlnz; --lnz; --xnzsub; --nzsub; --diag; --rhs;

    /* Forward substitution */

    for (int j = 1; j <= neqns; j++)
    {
        rhsj = rhs[j] / diag[j];
        rhs[j] = rhsj;
        i = xnzsub[j];
        for (int ii = xlnz[j]; ii < xlnz[j+1]; ii++)
        {
            isub = nzsub[i];
            rhs[isub] -= lnz[ii] * rhsj;
            i += 1;
        }
    }

    /* Backward substitution */

    int j = neqns;
    for (int jj = 1; jj <= neqns; jj++)
    {
        s = rhs[j];
        i = xnzsub[j];
        for (int ii = xlnz[j]; ii < xlnz[j+1]; ii++)
        {
            isub = nzsub[i];
            s -= lnz[ii] * rhs[isub];
            i += 1;
        }
        rhs[j] = s / diag[j];
        j -= 1;
    }

    /* Adjust from Fortran to C */

    ++xlnz; ++lnz; ++xnzsub; ++nzsub; ++diag; ++rhs;

}